

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_join_internal.h
# Opt level: O0

string * __thiscall
absl::lts_20250127::strings_internal::JoinRange<google::protobuf::RepeatedField<int>>
          (string *__return_storage_ptr__,strings_internal *this,RepeatedField<int> *range,
          string_view separator)

{
  const_iterator this_00;
  const_iterator first;
  char *in_R9;
  string_view separator_00;
  RepeatedField<int> *range_local;
  string_view separator_local;
  
  this_00 = std::begin<google::protobuf::RepeatedField<int>>((RepeatedField<int> *)this);
  first = std::end<google::protobuf::RepeatedField<int>>((RepeatedField<int> *)this);
  separator_00._M_str = in_R9;
  separator_00._M_len = separator._M_len;
  JoinRange<google::protobuf::internal::RepeatedIterator<int_const>>
            (__return_storage_ptr__,(strings_internal *)this_00.it_,
             (RepeatedIterator<const_int>)first.it_,(RepeatedIterator<const_int>)range,separator_00)
  ;
  return __return_storage_ptr__;
}

Assistant:

std::string JoinRange(const Range& range, absl::string_view separator) {
  using std::begin;
  using std::end;
  return JoinRange(begin(range), end(range), separator);
}